

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_algo_struct.c
# Opt level: O1

histprune_t *
histprune_init(int32 maxhmm,int32 maxhist,int32 maxword,int32 hmmhistbinsize,int32 numNodes)

{
  int iVar1;
  histprune_t *phVar2;
  int32 *piVar3;
  
  phVar2 = (histprune_t *)
           __ckd_calloc__(1,0x20,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fast_algo_struct.c"
                          ,0x145);
  phVar2->maxwpf = maxword;
  phVar2->maxhmmpf = maxhmm;
  phVar2->maxhistpf = maxhist;
  phVar2->hmm_hist_binsize = hmmhistbinsize;
  iVar1 = numNodes / hmmhistbinsize + 1;
  phVar2->hmm_hist_bins = iVar1;
  piVar3 = (int32 *)__ckd_calloc__((long)iVar1,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fast_algo_struct.c"
                                   ,0x150);
  phVar2->hmm_hist = piVar3;
  return phVar2;
}

Assistant:

histprune_t *
histprune_init(int32 maxhmm, int32 maxhist, int32 maxword,
               int32 hmmhistbinsize, int32 numNodes)
{
    histprune_t *h;
    int32 n;

    h = (histprune_t *) ckd_calloc(1, sizeof(histprune_t));
    h->maxwpf = maxword;
    h->maxhmmpf = maxhmm;
    h->maxhistpf = maxhist;
    h->hmm_hist_binsize = hmmhistbinsize;

    n = numNodes;
    n /= h->hmm_hist_binsize;

    h->hmm_hist_bins = n + 1;

    h->hmm_hist = (int32 *) ckd_calloc(h->hmm_hist_bins, sizeof(int32));


    return h;
}